

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

sxi32 FastJsonEncode(jx9_value *pValue,SyBlob *pOut,int iNest)

{
  undefined8 *puVar1;
  long lVar2;
  ulong uVar3;
  jx9_vm *pjVar4;
  uint uVar5;
  sxi32 sVar6;
  undefined8 *puVar7;
  ushort uVar8;
  sxu32 nSize;
  anon_union_8_3_18420de5_for_x *pData;
  jx9_value *pjVar9;
  jx9_hashmap_node *pNode;
  int c;
  jx9_value sKey;
  undefined1 local_7c [4];
  anon_union_8_3_18420de5_for_x local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  if (pValue == (jx9_value *)0x0) {
    uVar5 = 0x20;
  }
  else {
    uVar5 = pValue->iFlags;
  }
  if (0x3f < iNest) {
    return -7;
  }
  if ((uVar5 & 0x120) == 0) {
    if ((uVar5 & 8) == 0) {
      if ((uVar5 & 1) != 0) {
        local_7c = (undefined1  [4])0x8;
        uVar5 = (pValue->sBlob).nByte;
        local_78.iVal._0_4_ =
             uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
        sVar6 = SyBlobAppend(pOut,local_7c,1);
        if (sVar6 != 0) {
          return sVar6;
        }
        sVar6 = SyBlobAppend(pOut,&local_78,4);
        if (sVar6 != 0) {
          return sVar6;
        }
        pData = (anon_union_8_3_18420de5_for_x *)(pValue->sBlob).pBlob;
        nSize = (pValue->sBlob).nByte;
        goto LAB_00119d73;
      }
      if ((uVar5 & 2) != 0) {
        local_7c = (undefined1  [4])0xa;
        sVar6 = SyBlobAppend(pOut,local_7c,1);
        if (sVar6 != 0) {
          return sVar6;
        }
        uVar3 = (pValue->x).iVal;
        local_78.iVal =
             uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 | (uVar3 & 0xff0000000000) >> 0x18 |
             (uVar3 & 0xff00000000) >> 8 | (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 |
             (uVar3 & 0xff00) << 0x28 | uVar3 << 0x38;
        pData = &local_78;
        nSize = 8;
        goto LAB_00119d73;
      }
      if ((uVar5 & 4) != 0) {
        local_7c = (undefined1  [4])0x12;
        sVar6 = SyBlobAppend(pOut,local_7c,1);
        if (sVar6 != 0) {
          return sVar6;
        }
        uVar5 = pOut->nByte;
        local_78.iVal = local_78.iVal & 0xffffffffffff0000;
        sVar6 = SyBlobAppend(pOut,&local_78,2);
        if (sVar6 != 0) {
          return sVar6;
        }
        SyBlobFormat(pOut,"%.15g",(int)(pValue->x).iVal);
        uVar8 = ((short)pOut->nByte - (short)uVar5) - 2;
        *(ushort *)((long)pOut->pBlob + (ulong)uVar5) = uVar8 * 0x100 | uVar8 >> 8;
        return 0;
      }
      if ((uVar5 & 0x40) == 0) {
        return 0;
      }
      puVar1 = (undefined8 *)(pValue->x).pOther;
      puVar1[4] = puVar1[2];
      if ((*(byte *)(puVar1 + 8) & 1) == 0) {
        local_7c = (undefined1  [4])0x3;
        sVar6 = SyBlobAppend(pOut,local_7c,1);
        if (sVar6 != 0) {
          return sVar6;
        }
        do {
          puVar7 = (undefined8 *)puVar1[4];
          if (puVar7 == (undefined8 *)0x0) {
            puVar7 = (undefined8 *)0x0;
          }
          else {
            puVar1[4] = puVar7[9];
          }
          if (puVar7 == (undefined8 *)0x0) {
            sVar6 = 0;
            break;
          }
          lVar2 = *(long *)*puVar7;
          if (*(uint *)(puVar7 + 7) < *(uint *)(lVar2 + 0x210)) {
            pjVar9 = (jx9_value *)
                     ((ulong)(*(uint *)(puVar7 + 7) * *(int *)(lVar2 + 0x218)) +
                     *(long *)(lVar2 + 0x208));
          }
          else {
            pjVar9 = (jx9_value *)0x0;
          }
          sVar6 = FastJsonEncode(pjVar9,pOut,iNest + 1);
          if (sVar6 != 0) break;
          local_7c = (undefined1  [4])0x6;
          sVar6 = SyBlobAppend(pOut,local_7c,1);
        } while (sVar6 == 0);
        if (sVar6 != 0) {
          return sVar6;
        }
        local_7c = (undefined1  [4])0x4;
      }
      else {
        local_7c = (undefined1  [4])0x1;
        sVar6 = SyBlobAppend(pOut,local_7c,1);
        if (sVar6 != 0) {
          return sVar6;
        }
        local_68 = *puVar1;
        uStack_40 = 0;
        local_78.rVal = 0.0;
        local_58 = 0;
        uStack_50 = 0;
        local_48 = 0;
        uStack_70 = 0x20;
        uStack_60 = local_68;
        do {
          pNode = (jx9_hashmap_node *)puVar1[4];
          if (pNode == (jx9_hashmap_node *)0x0) {
            pNode = (jx9_hashmap_node *)0x0;
          }
          else {
            puVar1[4] = pNode->pPrev;
          }
          if (pNode == (jx9_hashmap_node *)0x0) {
            sVar6 = 0;
            break;
          }
          jx9HashmapExtractNodeKey(pNode,(jx9_value *)&local_78);
          sVar6 = FastJsonEncode((jx9_value *)&local_78,pOut,iNest + 1);
          if (sVar6 != 0) break;
          local_7c = (undefined1  [4])0x5;
          sVar6 = SyBlobAppend(pOut,local_7c,1);
          if (sVar6 != 0) break;
          pjVar4 = pNode->pMap->pVm;
          if (pNode->nValIdx < (pjVar4->aMemObj).nUsed) {
            pjVar9 = (jx9_value *)
                     ((ulong)(pNode->nValIdx * (pjVar4->aMemObj).eSize) +
                     (long)(pjVar4->aMemObj).pBase);
          }
          else {
            pjVar9 = (jx9_value *)0x0;
          }
          sVar6 = FastJsonEncode(pjVar9,pOut,iNest + 1);
          if (sVar6 != 0) break;
          local_7c = (undefined1  [4])0x6;
          sVar6 = SyBlobAppend(pOut,local_7c,1);
        } while (sVar6 == 0);
        jx9MemObjRelease((jx9_value *)&local_78);
        if (sVar6 != 0) {
          return sVar6;
        }
        local_7c = (undefined1  [4])0x2;
      }
    }
    else {
      local_7c = (undefined1  [4])(((pValue->x).iVal == 0) + 0x18);
    }
  }
  else {
    local_7c = (undefined1  [4])0x17;
  }
  pData = (anon_union_8_3_18420de5_for_x *)local_7c;
  nSize = 1;
LAB_00119d73:
  sVar6 = SyBlobAppend(pOut,pData,nSize);
  return sVar6;
}

Assistant:

UNQLITE_PRIVATE sxi32 FastJsonEncode(
	jx9_value *pValue, /* Value to encode */
	SyBlob *pOut,      /* Store encoded value here */
	int iNest          /* Nesting limit */ 
	)
{
	sxi32 iType = pValue ? pValue->iFlags : MEMOBJ_NULL;
	sxi32 rc = SXRET_OK;
	int c;
	if( iNest >= UNQLITE_FAST_JSON_NEST_LIMIT ){
		/* Nesting limit reached */
		return SXERR_LIMIT;
	}
	if( iType & (MEMOBJ_NULL|MEMOBJ_RES) ){
		/*
		 * Resources are encoded as null also.
		 */
		c = FJSON_NULL;
		rc = SyBlobAppend(pOut,(const void *)&c,sizeof(char));
	}else if( iType & MEMOBJ_BOOL ){
		c = pValue->x.iVal ? FJSON_TRUE : FJSON_FALSE;
		rc = SyBlobAppend(pOut,(const void *)&c,sizeof(char));
	}else if( iType & MEMOBJ_STRING ){
		unsigned char zBuf[sizeof(sxu32)]; /* String length */
		c = FJSON_STRING;
		SyBigEndianPack32(zBuf,SyBlobLength(&pValue->sBlob));
		rc = SyBlobAppend(pOut,(const void *)&c,sizeof(char));
		if( rc == SXRET_OK ){
			rc = SyBlobAppend(pOut,(const void *)zBuf,sizeof(zBuf));
			if( rc == SXRET_OK ){
				rc = SyBlobAppend(pOut,SyBlobData(&pValue->sBlob),SyBlobLength(&pValue->sBlob));
			}
		}
	}else if( iType & MEMOBJ_INT ){
		unsigned char zBuf[8];
		/* 64bit big endian integer */
		c = FJSON_INT64;
		rc = SyBlobAppend(pOut,(const void *)&c,sizeof(char));
		if( rc == SXRET_OK ){
			SyBigEndianPack64(zBuf,(sxu64)pValue->x.iVal);
			rc = SyBlobAppend(pOut,(const void *)zBuf,sizeof(zBuf));
		}
	}else if( iType & MEMOBJ_REAL ){
		/* Real number */
		c = FJSON_REAL;
		rc = SyBlobAppend(pOut,(const void *)&c,sizeof(char));
		if( rc == SXRET_OK ){
			sxu32 iOfft = SyBlobLength(pOut);
			rc = SyBlobAppendBig16(pOut,0);
			if( rc == SXRET_OK ){
				unsigned char *zBlob;
				SyBlobFormat(pOut,"%.15g",pValue->x.rVal);
				zBlob = (unsigned char *)SyBlobDataAt(pOut,iOfft);
				SyBigEndianPack16(zBlob,(sxu16)(SyBlobLength(pOut) - ( 2 + iOfft)));
			}
		}
	}else if( iType & MEMOBJ_HASHMAP ){
		/* A JSON object or array */
		jx9_hashmap *pMap = (jx9_hashmap *)pValue->x.pOther;
		jx9_hashmap_node *pNode;
		jx9_value *pEntry;
		/* Reset the hashmap loop cursor */
		jx9HashmapResetLoopCursor(pMap);
		if( pMap->iFlags & HASHMAP_JSON_OBJECT ){
			jx9_value sKey;
			/* A JSON object */
			c = FJSON_DOC_START; /* { */
			rc = SyBlobAppend(pOut,(const void *)&c,sizeof(char));
			if( rc == SXRET_OK ){
				jx9MemObjInit(pMap->pVm,&sKey);
				/* Encode object entries */
				while((pNode = jx9HashmapGetNextEntry(pMap)) != 0 ){
					/* Extract the key */
					jx9HashmapExtractNodeKey(pNode,&sKey);
					/* Encode it */
					rc = FastJsonEncode(&sKey,pOut,iNest+1);
					if( rc != SXRET_OK ){
						break;
					}
					c = FJSON_COLON;
					rc = SyBlobAppend(pOut,(const void *)&c,sizeof(char));
					if( rc != SXRET_OK ){
						break;
					}
					/* Extract the value */
					pEntry = jx9HashmapGetNodeValue(pNode);
					/* Encode it */
					rc = FastJsonEncode(pEntry,pOut,iNest+1);
					if( rc != SXRET_OK ){
						break;
					}
					/* Delimit the entry */
					c = FJSON_COMMA;
					rc = SyBlobAppend(pOut,(const void *)&c,sizeof(char));
					if( rc != SXRET_OK ){
						break;
					}
				}
				jx9MemObjRelease(&sKey);
				if( rc == SXRET_OK ){
					c = FJSON_DOC_END; /* } */
					rc = SyBlobAppend(pOut,(const void *)&c,sizeof(char));
				}
			}
		}else{
			/* A JSON array */
			c = FJSON_ARRAY_START; /* [ */
			rc = SyBlobAppend(pOut,(const void *)&c,sizeof(char));
			if( rc == SXRET_OK ){
				/* Encode array entries */
				while( (pNode = jx9HashmapGetNextEntry(pMap)) != 0 ){
					/* Extract the value */
					pEntry = jx9HashmapGetNodeValue(pNode);
					/* Encode it */
					rc = FastJsonEncode(pEntry,pOut,iNest+1);
					if( rc != SXRET_OK ){
						break;
					}
					/* Delimit the entry */
					c = FJSON_COMMA;
					rc = SyBlobAppend(pOut,(const void *)&c,sizeof(char));
					if( rc != SXRET_OK ){
						break;
					}
				}
				if( rc == SXRET_OK ){
					c = FJSON_ARRAY_END; /* ] */
					rc = SyBlobAppend(pOut,(const void *)&c,sizeof(char));
				}
			}
		}
	}
	return rc;
}